

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov2.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Allocator **ppAVar1;
  char *pcVar2;
  float fVar3;
  int *piVar4;
  pointer pOVar5;
  char cVar6;
  float fVar7;
  size_t sVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  float fVar12;
  int baseLine;
  undefined1 local_2f8 [12];
  float fStack_2ec;
  undefined8 local_2e8;
  vector<Object,_std::allocator<Object>_> objects;
  float mean_vals [3];
  Size label_size;
  Mat in;
  float norm_vals [3];
  float local_240;
  int local_23c;
  Mat out;
  Extractor ex;
  Net yolov2;
  Mat m;
  int local_88;
  int local_84;
  uchar *local_80;
  
  if (argc == 2) {
    pcVar2 = argv[1];
    std::__cxx11::string::string((string *)&yolov2,pcVar2,(allocator *)&ex);
    cv::imread((string *)&m,(int)&yolov2);
    if ((Allocator **)yolov2.opt._0_8_ != &yolov2.opt.workspace_allocator) {
      operator_delete((void *)yolov2.opt._0_8_);
    }
    cVar6 = cv::Mat::empty();
    if (cVar6 == '\0') {
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&yolov2);
      ncnn::Net::load_param(&yolov2,"mobilenet_yolo.param");
      ncnn::Net::load_model(&yolov2,"mobilenet_yolo.bin");
      ncnn::Mat::from_pixels_resize(&in,local_80,2,local_84,local_88,0x1a0,0x1a0,(Allocator *)0x0);
      mean_vals[0] = 1.0;
      mean_vals[1] = 1.0;
      mean_vals[2] = 1.0;
      norm_vals[0] = 0.007843;
      norm_vals[1] = 0.007843;
      norm_vals[2] = 0.007843;
      ncnn::Mat::substract_mean_normalize(&in,(float *)0x0,norm_vals);
      ncnn::Mat::substract_mean_normalize(&in,mean_vals,(float *)0x0);
      ncnn::Net::create_extractor(&ex,&yolov2);
      ncnn::Extractor::set_num_threads(&ex,4);
      ncnn::Extractor::input(&ex,"data",&in);
      out.elemsize._0_4_ = 0;
      out.elemsize._4_4_ = 0;
      out.elempack = 0;
      out.data = (void *)0x0;
      out.refcount._0_4_ = 0;
      out.refcount._4_4_ = 0;
      out.allocator = (Allocator *)0x0;
      out.dims = 0;
      out.w = 0;
      out.h = 0;
      out.c = 0;
      out.cstep = 0;
      ncnn::Extractor::extract(&ex,"detection_out",&out);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
        _M_finish = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      if (0 < out.h) {
        iVar10 = 0;
        do {
          lVar9 = (long)iVar10 * (long)out.w * CONCAT44(out.elemsize._4_4_,(undefined4)out.elemsize)
          ;
          local_2e8._4_4_ = *(float *)((long)out.data + lVar9 + 4);
          local_2e8._0_4_ = (int)*(float *)((long)out.data + lVar9);
          local_2f8._0_4_ = *(float *)((long)out.data + lVar9 + 8) * (float)local_84;
          local_2f8._4_4_ = *(float *)((long)out.data + lVar9 + 0xc) * (float)local_88;
          stack0xfffffffffffffd10 =
               (Extractor *)
               CONCAT44(*(float *)((long)out.data + lVar9 + 0x14) * (float)local_88 -
                        (float)local_2f8._4_4_,
                        *(float *)((long)out.data + lVar9 + 0x10) * (float)local_84 -
                        (float)local_2f8._0_4_);
          std::vector<Object,_std::allocator<Object>_>::push_back(&objects,(value_type *)local_2f8);
          iVar10 = iVar10 + 1;
        } while (iVar10 < out.h);
      }
      piVar4 = (int *)CONCAT44(out.refcount._4_4_,out.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (out.allocator == (Allocator *)0x0) {
            if (out.data != (void *)0x0) {
              free(out.data);
            }
          }
          else {
            (**(code **)(*(long *)out.allocator + 0x18))();
          }
        }
      }
      ncnn::Extractor::~Extractor(&ex);
      if (in.refcount != (int *)0x0) {
        LOCK();
        *in.refcount = *in.refcount + -1;
        UNLOCK();
        if (*in.refcount == 0) {
          if (in.allocator == (Allocator *)0x0) {
            if (in.data != (void *)0x0) {
              free(in.data);
            }
          }
          else {
            (**(code **)(*(long *)in.allocator + 0x18))();
          }
        }
      }
      ncnn::Net::~Net(&yolov2);
      cv::Mat::clone();
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar9 = 0;
        uVar11 = 0;
        do {
          pOVar5 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                   super__Vector_impl_data._M_start;
          fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                  SUB84((double)*(float *)((long)&(objects.
                                                  super__Vector_base<Object,_std::allocator<Object>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->prob +
                                          lVar9),0),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).x +
                                    lVar9),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).y +
                                    lVar9),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).width
                                    + lVar9),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).
                                            height + lVar9),
                  (ulong)*(uint *)((long)&(objects.
                                           super__Vector_base<Object,_std::allocator<Object>_>.
                                           _M_impl.super__Vector_impl_data._M_start)->label + lVar9)
                 );
          in.elemsize = 0;
          in.data = (void *)CONCAT44(in.data._4_4_,0x3010000);
          mean_vals[2] = (float)(int)ROUND(*(float *)((long)&(pOVar5->rect).width + lVar9));
          mean_vals[1] = (float)(int)ROUND(*(float *)((long)&(pOVar5->rect).y + lVar9));
          mean_vals[0] = (float)(int)ROUND(*(float *)((long)&(pOVar5->rect).x + lVar9));
          yolov2.opt.lightmode = false;
          yolov2.opt._1_3_ = 0;
          yolov2.opt.num_threads = 0x406fe000;
          yolov2.opt.blob_allocator = (Allocator *)0x0;
          yolov2.opt.workspace_allocator = (Allocator *)0x0;
          yolov2.opt.use_winograd_convolution = false;
          yolov2.opt.use_sgemm_convolution = false;
          yolov2.opt.use_int8_inference = false;
          yolov2.opt.use_vulkan_compute = false;
          yolov2.opt.use_fp16_packed = false;
          yolov2.opt.use_fp16_storage = false;
          yolov2.opt.use_fp16_arithmetic = false;
          yolov2.opt.use_int8_storage = false;
          in.refcount = (int *)&ex;
          cv::rectangle(&in,mean_vals,&yolov2,1,8,0);
          sprintf((char *)&yolov2,"%s %.1f%%",
                  SUB84((double)(*(float *)((long)&pOVar5->prob + lVar9) * 100.0),0),
                  _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel +
                  *(int *)(
                          _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel
                          + (long)*(int *)((long)&pOVar5->label + lVar9) * 4));
          in.data = &in.elemsize;
          sVar8 = strlen((char *)&yolov2);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&in,&yolov2,&yolov2.opt.lightmode + sVar8);
          cv::getTextSize((string *)&label_size,(int)&in,0.5,0,(int *)0x1);
          if ((size_t *)in.data != &in.elemsize) {
            operator_delete(in.data);
          }
          fVar7 = (float)(int)*(float *)((long)&(pOVar5->rect).x + lVar9);
          fVar12 = (float)(int)((*(float *)((long)&(pOVar5->rect).y + lVar9) -
                                (float)label_size.height) - 0.0);
          if ((int)fVar12 < 1) {
            fVar12 = 0.0;
          }
          fVar3 = (float)(ex.blob_mats.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_start._4_4_ - label_size.width);
          if (label_size.width + (int)fVar7 <=
              ex.blob_mats.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_) {
            fVar3 = fVar7;
          }
          local_2e8._0_4_ = 0;
          local_2e8._4_4_ = 0.0;
          local_2f8._0_4_ = 3.7909693e-37;
          norm_vals[1] = fVar12;
          norm_vals[0] = fVar3;
          norm_vals[2] = (float)label_size.width;
          in.data = (void *)0x406fe00000000000;
          in.refcount = (int *)0x406fe00000000000;
          in.elemsize = 0x406fe00000000000;
          in.elempack = 0;
          in._28_4_ = 0;
          unique0x10000d49 = &ex;
          cv::rectangle(local_2f8,norm_vals,&in,0xffffffff,8,0);
          local_2e8._0_4_ = 0;
          local_2e8._4_4_ = 0.0;
          local_2f8._0_4_ = 3.7909693e-37;
          unique0x10000d51 = &ex;
          in.data = &in.elemsize;
          sVar8 = strlen((char *)&yolov2);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&in,&yolov2,&yolov2.opt.lightmode + sVar8);
          local_23c = (int)fVar12 + label_size.height;
          out.data = (void *)0x0;
          out.refcount._0_4_ = 0;
          out.refcount._4_4_ = 0;
          out.elemsize._0_4_ = 0;
          out.elemsize._4_4_ = 0;
          out.elempack = 0;
          out._28_4_ = 0;
          local_240 = fVar3;
          cv::putText(0,local_2f8,&in,&local_240,0,&out,1,8,0);
          if ((size_t *)in.data != &in.elemsize) {
            operator_delete(in.data);
          }
          uVar11 = uVar11 + 1;
          lVar9 = lVar9 + 0x18;
        } while (uVar11 < (ulong)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      in.refcount = (int *)&ex;
      ppAVar1 = &yolov2.opt.workspace_allocator;
      yolov2.opt.workspace_allocator =
           (Allocator *)CONCAT26(yolov2.opt.workspace_allocator._6_2_,0x6567616d69);
      yolov2.opt.blob_allocator = (Allocator *)0x5;
      in.elemsize = 0;
      in.data = (void *)CONCAT44(in.data._4_4_,0x1010000);
      yolov2.opt._0_8_ = ppAVar1;
      cv::imshow((string *)&yolov2,(_InputArray *)&in);
      if ((Allocator **)yolov2.opt._0_8_ != ppAVar1) {
        operator_delete((void *)yolov2.opt._0_8_);
      }
      cv::waitKey(0);
      cv::Mat::~Mat((Mat *)&ex);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar10 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar2);
      iVar10 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    main_cold_1();
    iVar10 = -1;
  }
  return iVar10;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

#if NCNN_VULKAN
    ncnn::create_gpu_instance();
#endif // NCNN_VULKAN

    std::vector<Object> objects;
    detect_yolov2(m, objects);

#if NCNN_VULKAN
    ncnn::destroy_gpu_instance();
#endif // NCNN_VULKAN

    draw_objects(m, objects);

    return 0;
}